

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

int Sfm_LibFindComplInputGate(Vec_Wrd_t *vFuncs,int iGate,int nFanins,int iFanin,int *piFaninNew)

{
  word *pwVar1;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((iGate < 0) || (uVar9 = vFuncs->nSize, (int)uVar9 <= iGate)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                  ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  pwVar1 = vFuncs->pArray;
  bVar4 = (byte)(1 << ((byte)iFanin & 0x1f));
  if ((iFanin < 0) || (nFanins <= iFanin)) {
    __assert_fail("iFanin >= 0 && iFanin < nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0xa6,"int Sfm_LibFindComplInputGate(Vec_Wrd_t *, int, int, int, int *)");
  }
  uVar8 = (Exp_Truth6::Truth6[iFanin] & pwVar1[(uint)iGate]) >> (bVar4 & 0x3f) |
          Exp_Truth6::Truth6[iFanin] & pwVar1[(uint)iGate] << (bVar4 & 0x3f);
  if (piFaninNew == (int *)0x0) {
LAB_004be827:
    uVar7 = (ulong)uVar9;
    uVar3 = 0;
    do {
      if (pwVar1[uVar3] == uVar8) goto LAB_004be929;
      uVar3 = uVar3 + 1;
    } while (uVar7 != uVar3);
    if (iFanin != 0) {
      uVar6 = (ulong)(iFanin - 1);
      if (piFaninNew != (int *)0x0) goto LAB_004be865;
LAB_004be86c:
      bVar5 = (byte)(1 << ((byte)uVar6 & 0x1f));
      uVar9 = (uint)uVar7;
      if (0 < (int)uVar9) {
        uVar3 = 0;
        do {
          if (pwVar1[uVar3] ==
              ((s_PMasks[uVar6][1] & uVar8) << (bVar5 & 0x3f) | s_PMasks[uVar6][0] & uVar8 |
              (s_PMasks[uVar6][2] & uVar8) >> (bVar5 & 0x3f))) goto LAB_004be929;
          uVar3 = uVar3 + 1;
        } while (uVar7 != uVar3);
      }
    }
    iVar2 = iFanin + 1;
    if (iVar2 < nFanins) {
      if (piFaninNew != (int *)0x0) {
LAB_004be8cb:
        *piFaninNew = iVar2;
        uVar9 = vFuncs->nSize;
      }
      if (0 < (int)uVar9) {
        uVar3 = 0;
        do {
          if (pwVar1[uVar3] ==
              ((s_PMasks[(uint)iFanin][1] & uVar8) << (bVar4 & 0x3f) |
               uVar8 & s_PMasks[(uint)iFanin][0] |
              (s_PMasks[(uint)iFanin][2] & uVar8) >> (bVar4 & 0x3f))) goto LAB_004be929;
          uVar3 = uVar3 + 1;
        } while (uVar9 != uVar3);
      }
    }
    if (piFaninNew == (int *)0x0) goto LAB_004be924;
  }
  else {
    *piFaninNew = iFanin;
    uVar9 = vFuncs->nSize;
    if (0 < (int)uVar9) goto LAB_004be827;
    uVar6 = (ulong)(iFanin - 1);
    if (iFanin != 0) {
LAB_004be865:
      *piFaninNew = (int)uVar6;
      uVar7 = (ulong)(uint)vFuncs->nSize;
      goto LAB_004be86c;
    }
    iVar2 = 1;
    if (1 < nFanins) goto LAB_004be8cb;
  }
  *piFaninNew = -1;
LAB_004be924:
  uVar3 = 0xffffffff;
LAB_004be929:
  return (int)uVar3;
}

Assistant:

int Sfm_LibFindComplInputGate( Vec_Wrd_t * vFuncs, int iGate, int nFanins, int iFanin, int * piFaninNew )
{
    word uTruthGate = Vec_WrdEntry( vFuncs, iGate );
    word uTruthFlip = Abc_Tt6Flip( uTruthGate, iFanin ); 
    word uTruth, uTruthSwap;  int i;
    assert( iFanin >= 0 && iFanin < nFanins );
    if ( piFaninNew ) *piFaninNew = iFanin;
    Vec_WrdForEachEntry( vFuncs, uTruth, i )
        if ( uTruth == uTruthFlip )
            return i;
    if ( iFanin-1 >= 0 )
    {
        if ( piFaninNew ) *piFaninNew = iFanin-1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin-1 );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    if ( iFanin+1 < nFanins )
    {
        if ( piFaninNew ) *piFaninNew = iFanin+1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    // add checking for complemeting control input of a MUX
    if ( piFaninNew ) *piFaninNew = -1;
    return -1;
}